

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBOrderGenerator.cpp
# Opt level: O1

vector<ASBlock_*,_std::allocator<ASBlock_*>_> * __thiscall
BBOrderGenerator::getASMBBOrder
          (vector<ASBlock_*,_std::allocator<ASBlock_*>_> *__return_storage_ptr__,
          BBOrderGenerator *this,
          map<Value_*,_ASValue_*,_std::less<Value_*>,_std::allocator<std::pair<Value_*const,_ASValue_*>_>_>
          *map)

{
  pointer *pppAVar1;
  iterator __position;
  mapped_type *ppAVar2;
  pointer ppBVar3;
  ASBlock *asm_bb;
  BasicBlock *local_58;
  ASBlock *local_50;
  vector<BasicBlock_*,_std::allocator<BasicBlock_*>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<ASBlock_*,_std::allocator<ASBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ASBlock_*,_std::allocator<ASBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ASBlock_*,_std::allocator<ASBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<BasicBlock_*,_std::allocator<BasicBlock_*>_>::vector(&local_48,&this->_queue);
  ppBVar3 = local_48.super__Vector_base<BasicBlock_*,_std::allocator<BasicBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppBVar3 ==
        local_48.super__Vector_base<BasicBlock_*,_std::allocator<BasicBlock_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (local_48.super__Vector_base<BasicBlock_*,_std::allocator<BasicBlock_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<BasicBlock_*,_std::allocator<BasicBlock_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    local_58 = *ppBVar3;
    ppAVar2 = std::
              map<Value_*,_ASValue_*,_std::less<Value_*>,_std::allocator<std::pair<Value_*const,_ASValue_*>_>_>
              ::operator[](map,(key_type *)&local_58);
    if (*ppAVar2 == (mapped_type)0x0) {
      local_50 = (ASBlock *)0x0;
    }
    else {
      local_50 = (ASBlock *)__dynamic_cast(*ppAVar2,&ASValue::typeinfo,&ASBlock::typeinfo,0);
    }
    if (local_50 == (ASBlock *)0x0) break;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<ASBlock_*,_std::allocator<ASBlock_*>_>)._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<ASBlock_*,_std::allocator<ASBlock_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ASBlock*,std::allocator<ASBlock*>>::_M_realloc_insert<ASBlock*const&>
                ((vector<ASBlock*,std::allocator<ASBlock*>> *)__return_storage_ptr__,__position,
                 &local_50);
    }
    else {
      *__position._M_current = local_50;
      pppAVar1 = &(__return_storage_ptr__->super__Vector_base<ASBlock_*,_std::allocator<ASBlock_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + 1;
    }
    ppBVar3 = ppBVar3 + 1;
  }
  __assert_fail("asm_bb && \"Can\'t get ASM Block by BasicBlock\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zhuez16[P]bazinga_compiler/src/ASMIR/BBOrderGenerator.cpp"
                ,0x52,
                "std::vector<ASBlock *> BBOrderGenerator::getASMBBOrder(std::map<Value *, ASValue *> &)"
               );
}

Assistant:

std::vector<ASBlock *> BBOrderGenerator::getASMBBOrder(std::map<Value *, ASValue *> &map) {
    {
        std::vector<ASBlock *> ret;
        for (auto bb: getBBOrder()) {
            auto asm_bb = dynamic_cast<ASBlock *>(map[bb]);
            assert(asm_bb && "Can't get ASM Block by BasicBlock");
            ret.push_back(asm_bb);
        }
        return ret;
    }
}